

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfQueue.c
# Opt level: O2

sbfQueueItem sbfQueue_getItem(sbfQueue queue,sbfQueueCb cb,void *closure)

{
  u_int *puVar1;
  sbfPool psVar2;
  sbfPoolItemImpl *psVar3;
  sbfPoolItemImpl *psVar4;
  
  psVar2 = queue->mPool;
  LOCK();
  puVar1 = &psVar2->mCount->mGets;
  *puVar1 = *puVar1 + 1;
  UNLOCK();
  pthread_spin_lock(&psVar2->mLock);
  psVar3 = psVar2->mAvailable;
  if (psVar3 == (sbfPoolItemImpl *)0x0) {
    LOCK();
    psVar3 = psVar2->mFree;
    psVar2->mFree = (sbfPoolItemImpl *)0x0;
    UNLOCK();
    psVar4 = (sbfPoolItemImpl *)0x0;
    if (psVar3 == (sbfPoolItemImpl *)0x0) goto LAB_00103359;
  }
  psVar2->mAvailable = psVar3->mNext;
  psVar4 = psVar3;
LAB_00103359:
  pthread_spin_unlock(&psVar2->mLock);
  if (psVar4 == (sbfPoolItemImpl *)0x0) {
    LOCK();
    puVar1 = &psVar2->mCount->mNews;
    *puVar1 = *puVar1 + 1;
    UNLOCK();
    psVar4 = (sbfPoolItemImpl *)sbfMemory_malloc(psVar2->mSize);
    psVar4->mPool = psVar2;
    psVar4->mNext = (sbfPoolItemImpl *)0x0;
  }
  psVar4[1].mPool = (sbfPool)cb;
  psVar4[1].mNext = (sbfPoolItemImpl *)closure;
  return (sbfQueueItem)(psVar4 + 1);
}

Assistant:

sbfQueueItem
sbfQueue_getItem (sbfQueue queue, sbfQueueCb cb, void* closure)
{
    sbfQueueItem item;

    item = sbfPool_get (queue->mPool);
    item->mCb = cb;
    item->mClosure = closure;
    return item;
}